

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdom.cpp
# Opt level: O3

void __thiscall
QDomElementPrivate::setAttribute(QDomElementPrivate *this,QString *aname,QString *newValue)

{
  int iVar1;
  QDomNodePrivate *pQVar2;
  QDomNodePrivate *p;
  QDomElementPrivate *pQVar3;
  long in_FS_OFFSET;
  const_iterator local_48;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  local_48.e = (Chain **)&DAT_aaaaaaaaaaaaaaaa;
  local_48.i.d = (Data<QHashPrivate::MultiNode<QString,_QDomNodePrivate_*>_> *)&DAT_aaaaaaaaaaaaaaaa
  ;
  local_48.i.bucket = (size_t)&DAT_aaaaaaaaaaaaaaaa;
  QMultiHash<QString,_QDomNodePrivate_*>::constFindImpl<QString>(&local_48,&this->m_attr->map,aname)
  ;
  if ((local_48.e == (Chain **)0x0) ||
     (pQVar2 = (*local_48.e)->value, pQVar2 == (QDomNodePrivate *)0x0)) {
    pQVar2 = (QDomNodePrivate *)operator_new(0xa8);
    pQVar3 = this;
    do {
      iVar1 = (*(pQVar3->super_QDomNodePrivate)._vptr_QDomNodePrivate[0xb])(pQVar3);
      if ((iVar1 == 9) || (((pQVar3->super_QDomNodePrivate).field_0x98 & 2) == 0)) break;
      pQVar3 = (QDomElementPrivate *)(pQVar3->super_QDomNodePrivate).ownerNode;
    } while (pQVar3 != (QDomElementPrivate *)0x0);
    (pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i = 1;
    (pQVar2->name).d.d = (Data *)0x0;
    (pQVar2->name).d.ptr = (char16_t *)0x0;
    (pQVar2->name).d.size = 0;
    (pQVar2->value).d.d = (Data *)0x0;
    (pQVar2->value).d.ptr = (char16_t *)0x0;
    (pQVar2->value).d.size = 0;
    (pQVar2->prefix).d.d = (Data *)0x0;
    (pQVar2->prefix).d.ptr = (char16_t *)0x0;
    (pQVar2->prefix).d.size = 0;
    (pQVar2->namespaceURI).d.d = (Data *)0x0;
    (pQVar2->namespaceURI).d.ptr = (char16_t *)0x0;
    (pQVar2->namespaceURI).d.size = 0;
    pQVar2->ownerNode = &this->super_QDomNodePrivate;
    pQVar2->prev = (QDomNodePrivate *)0x0;
    pQVar2->next = (QDomNodePrivate *)0x0;
    pQVar2->first = (QDomNodePrivate *)0x0;
    pQVar2->last = (QDomNodePrivate *)0x0;
    pQVar2->field_0x98 = 0xff;
    pQVar2->lineNumber = -1;
    pQVar2->columnNumber = -1;
    pQVar2->_vptr_QDomNodePrivate = (_func_int **)&PTR__QDomNodePrivate_001291a0;
    QString::operator=(&pQVar2->name,aname);
    pQVar2->field_0xa4 = 0;
    (*pQVar2->_vptr_QDomNodePrivate[2])(pQVar2,newValue);
    LOCK();
    (pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + -1;
    UNLOCK();
    QDomNamedNodeMapPrivate::setNamedItem(this->m_attr,pQVar2);
  }
  else {
    (*pQVar2->_vptr_QDomNodePrivate[2])(pQVar2,newValue);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QDomElementPrivate::setAttribute(const QString& aname, const QString& newValue)
{
    QDomNodePrivate* n = m_attr->namedItem(aname);
    if (!n) {
        n = new QDomAttrPrivate(ownerDocument(), this, aname);
        n->setNodeValue(newValue);

        // Referencing is done by the map, so we set the reference counter back
        // to 0 here. This is ok since we created the QDomAttrPrivate.
        n->ref.deref();
        m_attr->setNamedItem(n);
    } else {
        n->setNodeValue(newValue);
    }
}